

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.h
# Opt level: O1

TV __thiscall Nova::Grid_Iterator_Cell<float,_1>::Location(Grid_Iterator_Cell<float,_1> *this)

{
  Grid<float,_1> *pGVar1;
  Vector<float,_1,_true> *data_copy;
  T_STORAGE *in_RDI;
  T_STORAGE TVar2;
  
  pGVar1 = (this->super_Grid_Iterator<float,_1>).grid;
  TVar2._M_elems[0] =
       (_Type)(((float)(this->super_Grid_Iterator<float,_1>).index._data._M_elems[0] + -0.5) *
               (pGVar1->dX)._data._M_elems[0] + (pGVar1->domain).min_corner._data._M_elems[0]);
  in_RDI->_M_elems[0] = (float)TVar2._M_elems[0];
  return (TV)TVar2._M_elems[0];
}

Assistant:

TV Location() const
    {return grid.Center(index);}